

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O1

mz_bool duckdb_miniz::tdefl_compress_normal(tdefl_compressor *d)

{
  mz_uint *pmVar1;
  mz_uint16 *pmVar2;
  byte bVar3;
  byte bVar4;
  mz_uint8 mVar5;
  ushort uVar6;
  tdefl_flush tVar7;
  mz_uint mVar8;
  mz_uint mVar9;
  uint uVar10;
  mz_uint8 *pmVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  byte *pbVar21;
  ulong uVar22;
  int iVar23;
  mz_uint pos;
  uint uVar24;
  int iVar26;
  uint uVar27;
  uint uVar28;
  byte *pbVar29;
  size_t sVar30;
  ulong uVar31;
  char cVar32;
  mz_uint8 local_7d;
  ulong local_60;
  uint local_58;
  int local_48;
  ulong uVar25;
  
  pbVar29 = d->m_pSrc;
  tVar7 = d->m_flush;
  local_48 = (int)d + 0x92aa;
  sVar30 = d->m_src_buf_left;
  do {
    if ((sVar30 == 0) && ((tVar7 == TDEFL_NO_FLUSH || (d->m_lookahead_size == 0)))) {
      uVar31 = 0;
      goto LAB_01ceb001;
    }
    mVar8 = d->m_lookahead_size;
    uVar14 = d->m_dict_size;
    if (uVar14 + mVar8 < 2) {
      if (sVar30 == 0) {
        uVar31 = 0;
      }
      else {
        uVar17 = d->m_lookahead_size;
        iVar26 = 0x102 - uVar17;
        if (0x102 < uVar17) {
          iVar26 = 0;
        }
        uVar22 = 0;
        uVar31 = sVar30;
        do {
          iVar23 = (int)uVar22;
          if (iVar26 == iVar23) goto LAB_01cea979;
          bVar3 = pbVar29[uVar22];
          mVar8 = d->m_lookahead_pos;
          uVar16 = uVar17 + iVar23 + mVar8 & 0x7fff;
          d->m_dict[uVar16] = bVar3;
          if (uVar16 < 0x101) {
            d->m_dict[(ulong)uVar16 + 0x8000] = bVar3;
          }
          d->m_lookahead_size = uVar17 + iVar23 + 1;
          if (2 < uVar14 + uVar17 + 1 + iVar23) {
            uVar27 = (uVar17 - 2) + iVar23 + mVar8 & 0x7fff;
            uVar16 = (uint)bVar3 ^ (uint)d->m_dict[(mVar8 + uVar17 + iVar23) - 1 & 0x7fff] << 5 ^
                     (d->m_dict[uVar27] & 0x1f) << 10;
            d->m_next[uVar27] = d->m_hash[uVar16];
            d->m_hash[uVar16] = ((short)mVar8 + (short)(uVar17 + iVar23)) - 2;
          }
          uVar22 = uVar22 + 1;
          uVar31 = uVar31 - 1;
        } while (sVar30 != uVar22);
        uVar31 = 0;
LAB_01cea979:
        pbVar29 = pbVar29 + uVar22;
      }
    }
    else {
      mVar9 = d->m_lookahead_pos;
      uVar17 = (mVar9 + mVar8) - 2;
      bVar3 = d->m_dict[uVar17 & 0x7fff];
      bVar4 = d->m_dict[(mVar9 + mVar8) - 1 & 0x7fff];
      uVar22 = sVar30 & 0xffffffff;
      if (0x102 - mVar8 <= sVar30) {
        uVar22 = (ulong)(0x102 - mVar8);
      }
      uVar31 = sVar30 - uVar22;
      d->m_lookahead_size = (int)uVar22 + mVar8;
      if ((int)uVar22 != 0) {
        uVar16 = mVar9 + mVar8;
        uVar20 = (ulong)((uint)bVar3 << 5 ^ (uint)bVar4);
        do {
          uVar16 = uVar16 & 0x7fff;
          bVar3 = *pbVar29;
          d->m_dict[uVar16] = bVar3;
          if (uVar16 < 0x101) {
            d->m_dict[(ulong)uVar16 + 0x8000] = bVar3;
          }
          pbVar29 = pbVar29 + 1;
          uVar20 = (ulong)(((uint)uVar20 & 0x3ff) << 5 ^ (uint)bVar3);
          d->m_next[uVar17 & 0x7fff] = d->m_hash[uVar20];
          d->m_hash[uVar20] = (mz_uint16)uVar17;
          uVar16 = uVar16 + 1;
          uVar17 = uVar17 + 1;
          uVar22 = uVar22 - 1;
        } while (uVar22 != 0);
      }
    }
    uVar17 = d->m_lookahead_size;
    uVar16 = 0x8000 - uVar17;
    if (uVar14 <= 0x8000 - uVar17) {
      uVar16 = uVar14;
    }
    d->m_dict_size = uVar16;
    cVar32 = '\x03';
    if (tVar7 != TDEFL_NO_FLUSH || 0x101 < uVar17) {
      uVar20 = (ulong)uVar17;
      uVar14 = d->m_saved_match_len;
      uVar22 = (ulong)uVar14;
      if (uVar14 == 0) {
        uVar22 = 2;
      }
      uVar27 = d->m_flags;
      uVar10 = d->m_lookahead_pos;
      uVar24 = uVar10 & 0x7fff;
      uVar25 = (ulong)uVar24;
      uVar13 = (uint)uVar22;
      if ((uVar27 & 0x90000) == 0) {
        uVar18 = 0;
        if ((uVar13 < uVar17) && (iVar26 = d->m_max_probes[0x1f < uVar13] - 1, iVar26 != 0)) {
          mVar5 = d->m_dict[uVar24 + uVar13];
          local_7d = d->m_dict[(uVar24 + uVar13) - 1];
          uVar18 = 0;
          uVar20 = uVar25;
          local_60 = uVar22;
          do {
            uVar13 = (uint)uVar22;
            iVar23 = 1 - iVar26;
            while( true ) {
              uVar6 = d->m_next[uVar20];
              if (uVar6 == 0) goto LAB_01ceac67;
              uVar28 = uVar10 - uVar6 & 0xffff;
              if (uVar16 < uVar28) goto LAB_01ceac67;
              uVar19 = uVar6 & 0x7fff;
              uVar20 = (ulong)uVar19;
              uVar12 = (uint)local_60;
              uVar19 = uVar12 + uVar19;
              if ((d->m_dict[uVar19] == mVar5) && (d->m_dict[uVar19 - 1] == local_7d)) break;
              uVar6 = d->m_next[uVar20];
              if (uVar6 == 0) goto LAB_01ceac67;
              uVar28 = uVar10 - uVar6 & 0xffff;
              if (uVar16 < uVar28) goto LAB_01ceac67;
              uVar19 = uVar6 & 0x7fff;
              uVar20 = (ulong)uVar19;
              uVar19 = uVar12 + uVar19;
              if ((d->m_dict[uVar19] == mVar5) && (d->m_dict[uVar19 - 1] == local_7d)) break;
              uVar6 = d->m_next[uVar20];
              if (uVar6 == 0) goto LAB_01ceac67;
              uVar28 = uVar10 - uVar6 & 0xffff;
              if (uVar16 < uVar28) goto LAB_01ceac67;
              uVar19 = uVar6 & 0x7fff;
              uVar20 = (ulong)uVar19;
              uVar19 = uVar12 + uVar19;
              if ((d->m_dict[uVar19] == mVar5) && (d->m_dict[uVar19 - 1] == local_7d)) break;
              iVar23 = iVar23 + 1;
              if (iVar23 == 1) goto LAB_01ceac67;
            }
            if (uVar28 == 0) break;
            uVar15 = 0;
            do {
              if (d->m_dict[uVar15 + uVar25] != d->m_dict[uVar15 + uVar20]) goto LAB_01ceabf7;
              uVar15 = uVar15 + 1;
            } while (uVar17 != (uint)uVar15);
            uVar15 = (ulong)uVar17;
LAB_01ceabf7:
            uVar13 = (uint)uVar15;
            if (uVar12 < uVar13) {
              uVar18 = uVar28;
              if (uVar13 == uVar17) break;
              mVar5 = d->m_dict[uVar13 + uVar24];
              local_7d = d->m_dict[(uVar13 + uVar24) - 1];
              uVar22 = uVar15 & 0xffffffff;
              local_60 = uVar15;
            }
            uVar13 = (uint)uVar22;
            iVar26 = -iVar23;
          } while (iVar23 != 0);
        }
      }
      else {
        uVar18 = 0;
        if ((uVar27 >> 0x13 & 1) == 0 && uVar16 != 0) {
          if (uVar20 == 0) {
            uVar22 = 0;
          }
          else {
            uVar15 = 0;
            do {
              uVar22 = uVar15;
              if (d->m_dict[uVar24 + (int)uVar15] != d->m_dict[uVar10 - 1 & 0x7fff]) break;
              uVar15 = uVar15 + 1;
              uVar22 = uVar20;
            } while (uVar20 != uVar15);
          }
          uVar13 = (uint)uVar22;
          uVar18 = (uint)(2 < uVar13);
          if (2 >= uVar13) {
            uVar13 = 0;
          }
        }
      }
LAB_01ceac67:
      if (((uVar13 == 3 && 0x1fff < uVar18) || (uVar24 == uVar18)) ||
         (((uVar27 >> 0x11 & 1) != 0 && (uVar13 < 6)))) {
        uVar18 = 0;
        uVar13 = 0;
      }
      if (uVar14 == 0) {
        if (uVar18 == 0) {
          bVar3 = d->m_dict[uVar25];
          d->m_total_lz_bytes = d->m_total_lz_bytes + 1;
          pbVar21 = d->m_pLZ_code_buf;
          d->m_pLZ_code_buf = pbVar21 + 1;
          *pbVar21 = bVar3;
          *d->m_pLZ_flags = *d->m_pLZ_flags >> 1;
          pmVar1 = &d->m_num_flags_left;
          *pmVar1 = *pmVar1 - 1;
          if (*pmVar1 == 0) {
            d->m_num_flags_left = 8;
            pmVar11 = d->m_pLZ_code_buf;
            d->m_pLZ_code_buf = pmVar11 + 1;
            d->m_pLZ_flags = pmVar11;
          }
          pmVar2 = d->m_huff_count[0] + bVar3;
          *pmVar2 = *pmVar2 + 1;
LAB_01ceaf71:
          uVar13 = 1;
        }
        else {
          if (((d->m_greedy_parsing == 0) && ((uVar27 >> 0x10 & 1) == 0)) && (uVar13 < 0x80))
          goto LAB_01ceaf5f;
          d->m_total_lz_bytes = d->m_total_lz_bytes + uVar13;
          *d->m_pLZ_code_buf = (mz_uint8)(uVar13 - 3);
          uVar14 = uVar18 - 1;
          d->m_pLZ_code_buf[1] = (mz_uint8)uVar14;
          d->m_pLZ_code_buf[2] = (mz_uint8)(uVar14 >> 8);
          d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
          *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
          pmVar1 = &d->m_num_flags_left;
          *pmVar1 = *pmVar1 - 1;
          if (*pmVar1 == 0) {
            d->m_num_flags_left = 8;
            pmVar11 = d->m_pLZ_code_buf;
            d->m_pLZ_code_buf = pmVar11 + 1;
            d->m_pLZ_flags = pmVar11;
          }
          pbVar21 = s_tdefl_large_dist_sym + (uVar14 >> 8 & 0x7f);
          if (uVar18 < 0x201) {
            pbVar21 = s_tdefl_small_dist_sym + (uVar14 & 0x1ff);
          }
          pmVar2 = d->m_huff_count[1] + *pbVar21;
          *pmVar2 = *pmVar2 + 1;
          if (2 < uVar13) {
            pmVar2 = d->m_huff_count[0] + *(ushort *)(s_tdefl_len_sym + (ulong)(uVar13 - 3) * 2);
            *pmVar2 = *pmVar2 + 1;
          }
        }
      }
      else {
        if (uVar14 < uVar13) {
          uVar14 = d->m_saved_lit;
          d->m_total_lz_bytes = d->m_total_lz_bytes + 1;
          pmVar11 = d->m_pLZ_code_buf;
          d->m_pLZ_code_buf = pmVar11 + 1;
          *pmVar11 = (mz_uint8)uVar14;
          *d->m_pLZ_flags = *d->m_pLZ_flags >> 1;
          pmVar1 = &d->m_num_flags_left;
          *pmVar1 = *pmVar1 - 1;
          if (*pmVar1 == 0) {
            d->m_num_flags_left = 8;
            pmVar11 = d->m_pLZ_code_buf;
            d->m_pLZ_code_buf = pmVar11 + 1;
            d->m_pLZ_flags = pmVar11;
          }
          pmVar2 = d->m_huff_count[0] + (uVar14 & 0xff);
          *pmVar2 = *pmVar2 + 1;
          if (uVar13 < 0x80) {
LAB_01ceaf5f:
            d->m_saved_lit = (uint)d->m_dict[uVar25];
            d->m_saved_match_dist = uVar18;
            d->m_saved_match_len = uVar13;
            goto LAB_01ceaf71;
          }
          d->m_total_lz_bytes = d->m_total_lz_bytes + uVar13;
          *d->m_pLZ_code_buf = (mz_uint8)(uVar13 - 3);
          uVar18 = uVar18 - 1;
          d->m_pLZ_code_buf[1] = (mz_uint8)uVar18;
          d->m_pLZ_code_buf[2] = (mz_uint8)(uVar18 >> 8);
          d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
          *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
          pmVar1 = &d->m_num_flags_left;
          *pmVar1 = *pmVar1 - 1;
          if (*pmVar1 == 0) {
            d->m_num_flags_left = 8;
            pmVar11 = d->m_pLZ_code_buf;
            d->m_pLZ_code_buf = pmVar11 + 1;
            d->m_pLZ_flags = pmVar11;
          }
          pbVar21 = s_tdefl_large_dist_sym + (uVar18 >> 8 & 0x7f);
          if (uVar18 < 0x200) {
            pbVar21 = s_tdefl_small_dist_sym + (uVar18 & 0x1ff);
          }
          pmVar2 = d->m_huff_count[1] + *pbVar21;
          *pmVar2 = *pmVar2 + 1;
          pmVar2 = d->m_huff_count[0] + *(ushort *)(s_tdefl_len_sym + (ulong)(uVar13 - 3) * 2);
          *pmVar2 = *pmVar2 + 1;
        }
        else {
          mVar8 = d->m_saved_match_dist;
          d->m_total_lz_bytes = d->m_total_lz_bytes + uVar14;
          *d->m_pLZ_code_buf = (mz_uint8)(uVar14 - 3);
          uVar17 = mVar8 - 1;
          d->m_pLZ_code_buf[1] = (mz_uint8)uVar17;
          d->m_pLZ_code_buf[2] = (mz_uint8)(uVar17 >> 8);
          d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
          *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
          pmVar1 = &d->m_num_flags_left;
          *pmVar1 = *pmVar1 - 1;
          if (*pmVar1 == 0) {
            d->m_num_flags_left = 8;
            pmVar11 = d->m_pLZ_code_buf;
            d->m_pLZ_code_buf = pmVar11 + 1;
            d->m_pLZ_flags = pmVar11;
          }
          pbVar21 = s_tdefl_large_dist_sym + (uVar17 >> 8 & 0x7f);
          if (uVar17 < 0x200) {
            pbVar21 = s_tdefl_small_dist_sym + (uVar17 & 0x1ff);
          }
          pmVar2 = d->m_huff_count[1] + *pbVar21;
          *pmVar2 = *pmVar2 + 1;
          if (2 < uVar14) {
            pmVar2 = d->m_huff_count[0] + *(ushort *)(s_tdefl_len_sym + (ulong)(uVar14 - 3) * 2);
            *pmVar2 = *pmVar2 + 1;
          }
          uVar13 = d->m_saved_match_len - 1;
        }
        d->m_saved_match_len = 0;
      }
      d->m_lookahead_pos = d->m_lookahead_pos + uVar13;
      d->m_lookahead_size = d->m_lookahead_size - uVar13;
      uVar13 = uVar13 + d->m_dict_size;
      if (0x7fff < uVar13) {
        uVar13 = 0x8000;
      }
      d->m_dict_size = uVar13;
      if (d->m_pLZ_code_buf <= d->m_lz_code_buf + 0xfff8) {
        cVar32 = '\0';
        if ((d->m_total_lz_bytes < 0x7c01) ||
           (((uint)(((int)d->m_pLZ_code_buf - local_48) * 0x73) >> 7 < d->m_total_lz_bytes &&
            ((d->m_flags & 0x80000) == 0)))) goto LAB_01ceafeb;
      }
      d->m_pSrc = pbVar29;
      d->m_src_buf_left = uVar31;
      uVar14 = tdefl_flush_block(d,0);
      cVar32 = uVar14 != 0;
      if ((bool)cVar32) {
        local_58 = ~uVar14 >> 0x1f;
      }
    }
LAB_01ceafeb:
    sVar30 = uVar31;
  } while (cVar32 == '\0');
  if (cVar32 == '\x03') {
LAB_01ceb001:
    d->m_pSrc = pbVar29;
    d->m_src_buf_left = uVar31;
    local_58 = 1;
  }
  return local_58;
}

Assistant:

static mz_bool tdefl_compress_normal(tdefl_compressor *d)
{
    const mz_uint8 *pSrc = d->m_pSrc;
    size_t src_buf_left = d->m_src_buf_left;
    tdefl_flush flush = d->m_flush;

    while ((src_buf_left) || ((flush) && (d->m_lookahead_size)))
    {
        mz_uint len_to_move, cur_match_dist, cur_match_len, cur_pos;
        /* Update dictionary and hash chains. Keeps the lookahead size equal to TDEFL_MAX_MATCH_LEN. */
        if ((d->m_lookahead_size + d->m_dict_size) >= (TDEFL_MIN_MATCH_LEN - 1))
        {
            mz_uint dst_pos = (d->m_lookahead_pos + d->m_lookahead_size) & TDEFL_LZ_DICT_SIZE_MASK, ins_pos = d->m_lookahead_pos + d->m_lookahead_size - 2;
            mz_uint hash = (d->m_dict[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] << TDEFL_LZ_HASH_SHIFT) ^ d->m_dict[(ins_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK];
            mz_uint num_bytes_to_process = (mz_uint)MZ_MIN(src_buf_left, TDEFL_MAX_MATCH_LEN - d->m_lookahead_size);
            const mz_uint8 *pSrc_end = pSrc + num_bytes_to_process;
            src_buf_left -= num_bytes_to_process;
            d->m_lookahead_size += num_bytes_to_process;
            while (pSrc != pSrc_end)
            {
                mz_uint8 c = *pSrc++;
                d->m_dict[dst_pos] = c;
                if (dst_pos < (TDEFL_MAX_MATCH_LEN - 1))
                    d->m_dict[TDEFL_LZ_DICT_SIZE + dst_pos] = c;
                hash = ((hash << TDEFL_LZ_HASH_SHIFT) ^ c) & (TDEFL_LZ_HASH_SIZE - 1);
                d->m_next[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] = d->m_hash[hash];
                d->m_hash[hash] = (mz_uint16)(ins_pos);
                dst_pos = (dst_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK;
                ins_pos++;
            }
        }
        else
        {
            while ((src_buf_left) && (d->m_lookahead_size < TDEFL_MAX_MATCH_LEN))
            {
                mz_uint8 c = *pSrc++;
                mz_uint dst_pos = (d->m_lookahead_pos + d->m_lookahead_size) & TDEFL_LZ_DICT_SIZE_MASK;
                src_buf_left--;
                d->m_dict[dst_pos] = c;
                if (dst_pos < (TDEFL_MAX_MATCH_LEN - 1))
                    d->m_dict[TDEFL_LZ_DICT_SIZE + dst_pos] = c;
                if ((++d->m_lookahead_size + d->m_dict_size) >= TDEFL_MIN_MATCH_LEN)
                {
                    mz_uint ins_pos = d->m_lookahead_pos + (d->m_lookahead_size - 1) - 2;
                    mz_uint hash = ((d->m_dict[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] << (TDEFL_LZ_HASH_SHIFT * 2)) ^ (d->m_dict[(ins_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK] << TDEFL_LZ_HASH_SHIFT) ^ c) & (TDEFL_LZ_HASH_SIZE - 1);
                    d->m_next[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] = d->m_hash[hash];
                    d->m_hash[hash] = (mz_uint16)(ins_pos);
                }
            }
        }
        d->m_dict_size = MZ_MIN(TDEFL_LZ_DICT_SIZE - d->m_lookahead_size, d->m_dict_size);
        if ((!flush) && (d->m_lookahead_size < TDEFL_MAX_MATCH_LEN))
            break;

        /* Simple lazy/greedy parsing state machine. */
        len_to_move = 1;
        cur_match_dist = 0;
        cur_match_len = d->m_saved_match_len ? d->m_saved_match_len : (TDEFL_MIN_MATCH_LEN - 1);
        cur_pos = d->m_lookahead_pos & TDEFL_LZ_DICT_SIZE_MASK;
        if (d->m_flags & (TDEFL_RLE_MATCHES | TDEFL_FORCE_ALL_RAW_BLOCKS))
        {
            if ((d->m_dict_size) && (!(d->m_flags & TDEFL_FORCE_ALL_RAW_BLOCKS)))
            {
                mz_uint8 c = d->m_dict[(cur_pos - 1) & TDEFL_LZ_DICT_SIZE_MASK];
                cur_match_len = 0;
                while (cur_match_len < d->m_lookahead_size)
                {
                    if (d->m_dict[cur_pos + cur_match_len] != c)
                        break;
                    cur_match_len++;
                }
                if (cur_match_len < TDEFL_MIN_MATCH_LEN)
                    cur_match_len = 0;
                else
                    cur_match_dist = 1;
            }
        }
        else
        {
            tdefl_find_match(d, d->m_lookahead_pos, d->m_dict_size, d->m_lookahead_size, &cur_match_dist, &cur_match_len);
        }
        if (((cur_match_len == TDEFL_MIN_MATCH_LEN) && (cur_match_dist >= 8U * 1024U)) || (cur_pos == cur_match_dist) || ((d->m_flags & TDEFL_FILTER_MATCHES) && (cur_match_len <= 5)))
        {
            cur_match_dist = cur_match_len = 0;
        }
        if (d->m_saved_match_len)
        {
            if (cur_match_len > d->m_saved_match_len)
            {
                tdefl_record_literal(d, (mz_uint8)d->m_saved_lit);
                if (cur_match_len >= 128)
                {
                    tdefl_record_match(d, cur_match_len, cur_match_dist);
                    d->m_saved_match_len = 0;
                    len_to_move = cur_match_len;
                }
                else
                {
                    d->m_saved_lit = d->m_dict[cur_pos];
                    d->m_saved_match_dist = cur_match_dist;
                    d->m_saved_match_len = cur_match_len;
                }
            }
            else
            {
                tdefl_record_match(d, d->m_saved_match_len, d->m_saved_match_dist);
                len_to_move = d->m_saved_match_len - 1;
                d->m_saved_match_len = 0;
            }
        }
        else if (!cur_match_dist)
            tdefl_record_literal(d, d->m_dict[MZ_MIN(cur_pos, sizeof(d->m_dict) - 1)]);
        else if ((d->m_greedy_parsing) || (d->m_flags & TDEFL_RLE_MATCHES) || (cur_match_len >= 128))
        {
            tdefl_record_match(d, cur_match_len, cur_match_dist);
            len_to_move = cur_match_len;
        }
        else
        {
            d->m_saved_lit = d->m_dict[MZ_MIN(cur_pos, sizeof(d->m_dict) - 1)];
            d->m_saved_match_dist = cur_match_dist;
            d->m_saved_match_len = cur_match_len;
        }
        /* Move the lookahead forward by len_to_move bytes. */
        d->m_lookahead_pos += len_to_move;
        MZ_ASSERT(d->m_lookahead_size >= len_to_move);
        d->m_lookahead_size -= len_to_move;
        d->m_dict_size = MZ_MIN(d->m_dict_size + len_to_move, (mz_uint)TDEFL_LZ_DICT_SIZE);
        /* Check if it's time to flush the current LZ codes to the internal output buffer. */
        if ((d->m_pLZ_code_buf > &d->m_lz_code_buf[TDEFL_LZ_CODE_BUF_SIZE - 8]) ||
            ((d->m_total_lz_bytes > 31 * 1024) && (((((mz_uint)(d->m_pLZ_code_buf - d->m_lz_code_buf) * 115) >> 7) >= d->m_total_lz_bytes) || (d->m_flags & TDEFL_FORCE_ALL_RAW_BLOCKS))))
        {
            int n;
            d->m_pSrc = pSrc;
            d->m_src_buf_left = src_buf_left;
            if ((n = tdefl_flush_block(d, 0)) != 0)
                return (n < 0) ? MZ_FALSE : MZ_TRUE;
        }
    }

    d->m_pSrc = pSrc;
    d->m_src_buf_left = src_buf_left;
    return MZ_TRUE;
}